

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

void __thiscall
Args::GroupIface::GroupIface<char_const(&)[3]>(GroupIface *this,char (*name) [3],bool required)

{
  allocator local_19;
  
  (this->super_ArgIface).m_cmdLine = (CmdLine *)0x0;
  (this->super_ArgIface)._vptr_ArgIface = (_func_int **)&PTR__GroupIface_00136c98;
  (this->m_children).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).
  super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_name,*name,&local_19);
  this->m_required = required;
  return;
}

Assistant:

explicit GroupIface( T && name,
		bool required = false )
		:	m_name( std::forward< T > ( name ) )
		,	m_required( required )
	{
	}